

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd_linux.c
# Opt level: O0

int system_forkfd_pidfd_set_flags(int pidfd,int flags)

{
  uint uVar1;
  uint in_ESI;
  int in_EDI;
  
  if ((in_ESI & 1) == 0) {
    fcntl(in_EDI,2,0);
  }
  if ((in_ESI & 2) != 0) {
    uVar1 = fcntl(in_EDI,3);
    fcntl(in_EDI,4,(ulong)(uVar1 | 0x800));
  }
  return in_EDI;
}

Assistant:

static int system_forkfd_pidfd_set_flags(int pidfd, int flags)
{
    if ((flags & FFD_CLOEXEC) == 0) {
        /* pidfd defaults to O_CLOEXEC */
        fcntl(pidfd, F_SETFD, 0);
    }
    if (flags & FFD_NONBLOCK)
        fcntl(pidfd, F_SETFL, fcntl(pidfd, F_GETFL) | O_NONBLOCK);
    return pidfd;
}